

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_test.cpp
# Opt level: O3

void __thiscall license::test::print_and_read::test_method(print_and_read *this)

{
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar1;
  ostream *poVar2;
  HwIdentifier id2;
  HwIdentifier pc_id;
  string pc_id_str;
  HwIdentifier local_100;
  HwIdentifier local_f0;
  array<unsigned_char,_7UL> local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  shared_count sStack_c8;
  string local_c0;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  builtin_memcpy(local_e0._M_elems,"BBBBBBB",7);
  hw_identifier::HwIdentifier::HwIdentifier(&local_f0);
  hw_identifier::HwIdentifier::set_data(&local_f0,&local_e0);
  hw_identifier::HwIdentifier::set_identification_strategy(&local_f0,STRATEGY_ETHERNET);
  hw_identifier::HwIdentifier::print_abi_cxx11_(&local_c0,&local_f0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)std::cout,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  hw_identifier::HwIdentifier::HwIdentifier(&local_100,&local_c0);
  local_30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x3c);
  LVar1 = hw_identifier::HwIdentifier::get_identification_strategy(&local_100);
  local_d8 = LVar1 == STRATEGY_ETHERNET;
  local_d0 = 0;
  sStack_c8.pi_ = (sp_counted_base *)0x0;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_001ab7a8;
  local_50 = boost::unit_test::lazy_ostream::inst;
  local_48 = "Strategy decoded correctly";
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_c8);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3d);
  local_d8 = hw_identifier::HwIdentifier::data_match(&local_100,&local_e0);
  local_d0 = 0;
  sStack_c8.pi_ = (sp_counted_base *)0x0;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_001ab7e8;
  local_50 = boost::unit_test::lazy_ostream::inst;
  local_48 = "Data deserialized correctly";
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_c8);
  hw_identifier::HwIdentifier::~HwIdentifier(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  hw_identifier::HwIdentifier::~HwIdentifier(&local_f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(print_and_read) {
	array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> data = {0x42, 0x42, 0x42, 0x42, 0x42, 0x42, 0x42};
	HwIdentifier pc_id;
	pc_id.set_data(data);
	pc_id.set_identification_strategy(LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_ETHERNET);
	string pc_id_str = pc_id.print();
	cout << pc_id_str << endl;
	const HwIdentifier id2(pc_id_str);
	BOOST_CHECK_MESSAGE(id2.get_identification_strategy() == LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_ETHERNET,
						"Strategy decoded correctly");
	BOOST_CHECK_MESSAGE(id2.data_match(data), "Data deserialized correctly");
}